

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.h
# Opt level: O1

void __thiscall trun::TestResponseProxy::~TestResponseProxy(TestResponseProxy *this)

{
  ~TestResponseProxy(this);
  operator_delete(this,0xb8);
  return;
}

Assistant:

virtual ~TestResponseProxy() = default;